

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O1

void __thiscall Assimp::OptimizeGraphProcess::OptimizeGraphProcess(OptimizeGraphProcess *this)

{
  _Rb_tree_header *p_Var1;
  
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__OptimizeGraphProcess_0082de28;
  this->mScene = (aiScene *)0x0;
  p_Var1 = &(this->locked)._M_t._M_impl.super__Rb_tree_header;
  (this->locked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->locked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->locked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->locked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->locked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->locked_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->locked_nodes;
  (this->locked_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->locked_nodes;
  (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->locked_nodes).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->nodes_in = 0;
  this->nodes_out = 0;
  this->count_merged = 0;
  return;
}

Assistant:

OptimizeGraphProcess::OptimizeGraphProcess() :
		mScene(),
		nodes_in(),
		nodes_out(),
		count_merged() {
	// empty
}